

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O1

exp_number __thiscall
ising::free_energy::square::transfer_matrix<double>::product_D
          (transfer_matrix<double> *this,vector<double,_std::allocator<double>_> *diag,
          vector<double,_std::allocator<double>_> *diag_10,
          vector<double,_std::allocator<double>_> *diag_20,
          vector<double,_std::allocator<double>_> *diag_01,
          vector<double,_std::allocator<double>_> *diag_02,exp_number *factor,
          vector<double,_std::allocator<double>_> *v,vector<double,_std::allocator<double>_> *v_10,
          vector<double,_std::allocator<double>_> *v_20,
          vector<double,_std::allocator<double>_> *v_01,
          vector<double,_std::allocator<double>_> *v_02)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  exp_number<double> *res;
  long lVar12;
  long lVar13;
  double dVar14;
  value_type_conflict2 extraout_XMM0_Qa;
  double dVar15;
  exp_number eVar16;
  exp_number<double> local_40;
  
  pdVar1 = (diag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (diag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar13 = (long)pdVar2 - (long)pdVar1 >> 3;
  dVar14 = 0.0;
  if (pdVar2 != pdVar1) {
    pdVar3 = (diag_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (diag_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (diag_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (diag_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      dVar15 = pdVar5[lVar12];
      pdVar7[lVar12] =
           pdVar1[lVar12] * pdVar7[lVar12] +
           pdVar3[lVar12] * pdVar4[lVar12] + (dVar15 + dVar15) * pdVar6[lVar12];
      pdVar6[lVar12] = pdVar5[lVar12] * pdVar4[lVar12] + pdVar1[lVar12] * pdVar6[lVar12];
      dVar15 = pdVar9[lVar12];
      pdVar11[lVar12] =
           pdVar1[lVar12] * pdVar11[lVar12] +
           pdVar8[lVar12] * pdVar4[lVar12] + (dVar15 + dVar15) * pdVar10[lVar12];
      pdVar10[lVar12] = pdVar9[lVar12] * pdVar4[lVar12] + pdVar1[lVar12] * pdVar10[lVar12];
      dVar15 = pdVar1[lVar12] * pdVar4[lVar12];
      pdVar4[lVar12] = dVar15;
      dVar14 = dVar14 + dVar15 * dVar15;
      lVar12 = lVar12 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar12);
  }
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  dVar14 = 1.0 / dVar14;
  if (pdVar2 != pdVar1) {
    pdVar1 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      pdVar1[lVar12] = pdVar1[lVar12] * dVar14;
      pdVar2[lVar12] = pdVar2[lVar12] * dVar14;
      pdVar3[lVar12] = pdVar3[lVar12] * dVar14;
      pdVar4[lVar12] = pdVar4[lVar12] * dVar14;
      pdVar5[lVar12] = pdVar5[lVar12] * dVar14;
      lVar12 = lVar12 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar12);
  }
  *(value_type_conflict2 *)this = factor->log_;
  *(int32_t *)(this + 8) = factor->sign_;
  standards::exp_number<double>::exp_number(&local_40,dVar14);
  standards::exp_number<double>::operator/=((exp_number<double> *)this,&local_40);
  eVar16._8_8_ = this;
  eVar16.log_ = extraout_XMM0_Qa;
  return eVar16;
}

Assistant:

static exp_number product_D(
      std::vector<real_t> const &diag, std::vector<real_t> const &diag_10,
      std::vector<real_t> const &diag_20, std::vector<real_t> const &diag_01,
      std::vector<real_t> const &diag_02, exp_number factor,
      std::vector<real_t> &v, std::vector<real_t> &v_10,
      std::vector<real_t> &v_20, std::vector<real_t> &v_01,
      std::vector<real_t> &v_02) {
    uint_t dim = diag.size();
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] =
          diag_20[c] * v[c] + 2 * diag_10[c] * v_10[c] + diag[c] * v_20[c];
      v_10[c] = diag_10[c] * v[c] + diag[c] * v_10[c];
      v_02[c] =
          diag_02[c] * v[c] + 2 * diag_01[c] * v_01[c] + diag[c] * v_02[c];
      v_01[c] = diag_01[c] * v[c] + diag[c] * v_01[c];
      v[c] = diag[c] * v[c];
      norm2 += v[c] * v[c];
    }
    auto norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }